

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O3

bool __thiscall
testing::internal::OnCallSpec<bool_(unsigned_short)>::Matches
          (OnCallSpec<bool_(unsigned_short)> *this,ArgumentTuple *args)

{
  char cVar1;
  undefined1 uVar2;
  DummyMatchResultListener dummy;
  
  cVar1 = (**(code **)(**(long **)(this + 0x18) + 0x20))();
  if (cVar1 == '\0') {
    uVar2 = 0;
  }
  else {
    uVar2 = (**(code **)(**(long **)(this + 0x30) + 0x20))(*(long **)(this + 0x30),args);
  }
  return (bool)uVar2;
}

Assistant:

bool Matches(const ArgumentTuple& args) const {
    return TupleMatches(matchers_, args) && extra_matcher_.Matches(args);
  }